

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

int __thiscall Fl_Preferences::Node::nChildren(Node *this)

{
  Node *local_28;
  Node *nd;
  int cnt;
  Node *this_local;
  
  if (((byte)this->field_0x30 >> 2 & 1) == 0) {
    nd._4_4_ = 0;
    for (local_28 = this->child_; local_28 != (Node *)0x0; local_28 = local_28->next_) {
      nd._4_4_ = nd._4_4_ + 1;
    }
    this_local._4_4_ = nd._4_4_;
  }
  else {
    this_local._4_4_ = this->nIndex_;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Preferences::Node::nChildren() {
  if (indexed_) {
    return nIndex_;
  } else {
    int cnt = 0;
    for ( Node *nd = child_; nd; nd = nd->next_ )
      cnt++;
    return cnt;
  }
}